

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics-graphics.cpp
# Opt level: O2

string * Statistics::Graphics::MessageScoreSavedPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream score_saved_richtext;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  poVar1 = std::operator<<((ostream *)aoStack_188,"\n");
  poVar1 = Color::operator<<(poVar1,&green);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  poVar1 = std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<(poVar1,"Score saved!");
  poVar1 = Color::operator<<(poVar1,&bold_off);
  poVar1 = Color::operator<<(poVar1,&def);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return in_RDI;
}

Assistant:

std::string MessageScoreSavedPrompt() {
  constexpr auto score_saved_text = "Score saved!";
  constexpr auto sp = "  ";
  std::ostringstream score_saved_richtext;
  score_saved_richtext << "\n"
                       << green << bold_on << sp << score_saved_text << bold_off
                       << def << "\n";
  return score_saved_richtext.str();
}